

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int gmatch(lua_State *L)

{
  StkId pTVar1;
  StkId pTVar2;
  StkId pTVar3;
  
  luaL_checklstring(L,1,(size_t *)0x0);
  luaL_checklstring(L,2,(size_t *)0x0);
  pTVar3 = L->top;
  pTVar2 = L->base;
  pTVar1 = pTVar2 + 2;
  if (pTVar3 < pTVar1) {
    do {
      pTVar3->tt = 0;
      pTVar3 = pTVar3 + 1;
    } while (pTVar3 < pTVar1);
    L->top = pTVar3;
  }
  L->top = pTVar1;
  pTVar2[2].value.gc = (GCObject *)0x0;
  pTVar2[2].tt = 3;
  L->top = L->top + 1;
  lua_pushcclosure(L,gmatch_aux,3);
  return 1;
}

Assistant:

static int gmatch(lua_State*L){
luaL_checkstring(L,1);
luaL_checkstring(L,2);
lua_settop(L,2);
lua_pushinteger(L,0);
lua_pushcclosure(L,gmatch_aux,3);
return 1;
}